

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

int Inv(double *src,double (*dst) [4],double *determinant,double *pivot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  int iVar15;
  double *pdVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 *puVar21;
  int iVar22;
  double *pdVar23;
  int iVar24;
  int j1;
  ulong uVar25;
  bool bVar26;
  byte bVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined4 uVar36;
  undefined4 uVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  double dVar44;
  double dVar45;
  double dVar46;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  double local_e8 [4];
  double local_c8;
  double local_c0;
  undefined1 auStack_b8 [16];
  double local_a8;
  double local_a0;
  undefined1 auStack_98 [16];
  double local_88;
  double local_80;
  double dStack_78;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  bVar27 = 0;
  *pivot = 0.0;
  *determinant = 0.0;
  local_108 = ZEXT816(0);
  local_128 = ZEXT816(0);
  local_138 = ZEXT816(0);
  local_158 = ZEXT816(0);
  local_f8 = ZEXT816(0x3ff0000000000000) << 0x40;
  local_118 = ZEXT816(0x3ff0000000000000);
  local_148 = ZEXT816(0x3ff0000000000000) << 0x40;
  local_168 = ZEXT816(0x3ff0000000000000);
  pdVar16 = local_e8;
  pdVar23 = pdVar16;
  for (lVar17 = 0x10; lVar17 != 0; lVar17 = lVar17 + -1) {
    *pdVar23 = *src;
    src = src + 1;
    pdVar23 = pdVar23 + 1;
  }
  local_68 = ABS(local_e8[0]);
  uVar25 = 0;
  uVar19 = 0;
  for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
    for (uVar20 = 0; uVar20 != 4; uVar20 = uVar20 + 1) {
      if (local_68 < ABS(pdVar16[uVar20])) {
        uVar25 = uVar18 & 0xffffffff;
        uVar19 = uVar20 & 0xffffffff;
        local_68 = ABS(pdVar16[uVar20]);
      }
    }
    pdVar16 = pdVar16 + 4;
  }
  uStack_60 = 0;
  *pivot = local_68;
  iVar22 = (int)uVar25;
  bVar26 = iVar22 != 0;
  if (bVar26) {
    SwapRow(&local_e8,0,iVar22);
    SwapRow((double (*) [4])local_168,0,iVar22);
  }
  iVar22 = (int)uVar19;
  if (iVar22 != 0) {
    SwapCol(&local_e8,0,iVar22);
    bVar26 = !bVar26;
  }
  iVar24 = 0;
  if (0.0 < local_68) {
    auVar13._8_8_ = local_e8[2];
    auVar13._0_8_ = local_e8[1];
    uVar36 = SUB84(local_e8[0],0);
    uVar37 = (undefined4)((ulong)local_e8[0] >> 0x20);
    auVar34._8_4_ = uVar36;
    auVar34._0_8_ = local_e8[0];
    auVar34._12_4_ = uVar37;
    auVar34 = divpd(auVar13,auVar34);
    local_e8[1] = auVar34._0_8_;
    local_e8[2] = auVar34._8_8_;
    local_e8[3] = local_e8[3] / local_e8[0];
    auVar1._8_4_ = uVar36;
    auVar1._0_8_ = local_e8[0];
    auVar1._12_4_ = uVar37;
    local_168 = divpd(local_168,auVar1);
    auVar2._8_4_ = uVar36;
    auVar2._0_8_ = local_e8[0];
    auVar2._12_4_ = uVar37;
    local_158 = divpd(local_158,auVar2);
    dVar28 = local_68 * 2.220446049250313e-16;
    dVar45 = local_168._0_8_;
    dVar32 = local_168._8_8_;
    dVar29 = local_158._0_8_;
    dVar46 = local_158._8_8_;
    if (dVar28 < ABS(local_c8)) {
      local_c0 = local_c0 - local_c8 * local_e8[1];
      auStack_b8._8_8_ = (double)auStack_b8._8_8_ - local_c8 * local_e8[3];
      auStack_b8._0_8_ = (double)auStack_b8._0_8_ - local_c8 * local_e8[2];
      local_148._8_8_ = (double)local_148._8_8_ - local_c8 * dVar32;
      local_148._0_8_ = (double)local_148._0_8_ - local_c8 * dVar45;
      local_138._8_8_ = (double)local_138._8_8_ - local_c8 * dVar46;
      local_138._0_8_ = (double)local_138._0_8_ - local_c8 * dVar29;
    }
    if (dVar28 < ABS(local_a8)) {
      local_a0 = local_a0 - local_a8 * local_e8[1];
      auStack_98._8_8_ = (double)auStack_98._8_8_ - local_a8 * local_e8[3];
      auStack_98._0_8_ = (double)auStack_98._0_8_ - local_a8 * local_e8[2];
      local_128._8_8_ = (double)local_128._8_8_ - local_a8 * dVar32;
      local_128._0_8_ = (double)local_128._0_8_ - local_a8 * dVar45;
      local_118._8_8_ = (double)local_118._8_8_ - local_a8 * dVar46;
      local_118._0_8_ = (double)local_118._0_8_ - local_a8 * dVar29;
    }
    if (dVar28 < ABS(local_88)) {
      local_80 = local_80 - local_e8[1] * local_88;
      dVar28 = dStack_78 - local_e8[2] * local_88;
      auVar3._8_4_ = SUB84(dVar28,0);
      auVar3._0_8_ = local_80;
      auVar3._12_4_ = (int)((ulong)dVar28 >> 0x20);
      dStack_78 = auVar3._8_8_;
      local_70 = local_70 - local_e8[3] * local_88;
      local_108._8_8_ = (double)local_108._8_8_ - dVar32 * local_88;
      local_108._0_8_ = (double)local_108._0_8_ - dVar45 * local_88;
      local_f8._8_8_ = (double)local_f8._8_8_ - local_88 * dVar46;
      local_f8._0_8_ = (double)local_f8._0_8_ - local_88 * dVar29;
    }
    pdVar16 = &local_c0;
    local_58 = ABS(local_c0);
    uVar25 = 1;
    uVar18 = 1;
    for (uVar19 = 1; uVar19 != 4; uVar19 = uVar19 + 1) {
      uVar20 = 0;
      while (uVar20 != 3) {
        dVar28 = ABS(pdVar16[uVar20]);
        uVar20 = uVar20 + 1;
        if (local_58 < dVar28) {
          uVar25 = uVar19;
        }
        uVar25 = uVar25 & 0xffffffff;
        if (local_58 < dVar28) {
          uVar18 = uVar20 & 0xffffffff;
          local_58 = dVar28;
        }
      }
      pdVar16 = pdVar16 + 4;
    }
    if (local_58 < local_68) {
      *pivot = local_58;
      uStack_60 = 0;
      local_68 = local_58;
    }
    iVar24 = (int)uVar25;
    local_48 = 1.0 / local_e8[0];
    uStack_40 = 0;
    uStack_50 = 0;
    if (iVar24 != 1) {
      SwapRow(&local_e8,1,iVar24);
      SwapRow((double (*) [4])local_168,1,iVar24);
      bVar26 = (bool)(bVar26 ^ 1);
    }
    j1 = (int)uVar18;
    if (j1 != 1) {
      SwapCol(&local_e8,1,j1);
      bVar26 = (bool)(bVar26 ^ 1);
    }
    if (local_58 <= 0.0) {
      iVar24 = 1;
    }
    else {
      uVar36 = SUB84(local_c0,0);
      uVar37 = (undefined4)((ulong)local_c0 >> 0x20);
      auVar4._8_4_ = uVar36;
      auVar4._0_8_ = local_c0;
      auVar4._12_4_ = uVar37;
      auVar30 = divpd(auStack_b8,auVar4);
      auStack_b8 = auVar30;
      auVar5._8_4_ = uVar36;
      auVar5._0_8_ = local_c0;
      auVar5._12_4_ = uVar37;
      local_148 = divpd(local_148,auVar5);
      auVar6._8_4_ = uVar36;
      auVar6._0_8_ = local_c0;
      auVar6._12_4_ = uVar37;
      local_138 = divpd(local_138,auVar6);
      dVar42 = local_58 * 2.220446049250313e-16;
      dVar28 = auVar30._0_8_;
      dVar29 = auVar30._8_8_;
      dVar32 = local_148._0_8_;
      dVar33 = local_148._8_8_;
      dVar46 = local_138._0_8_;
      dVar45 = local_138._8_8_;
      if (dVar42 < ABS(local_e8[1])) {
        local_e8[2] = local_e8[2] - local_e8[1] * dVar28;
        dVar44 = local_e8[3] - local_e8[1] * dVar29;
        auVar7._8_4_ = SUB84(dVar44,0);
        auVar7._0_8_ = local_e8[2];
        auVar7._12_4_ = (int)((ulong)dVar44 >> 0x20);
        local_e8[3] = auVar7._8_8_;
        local_168._8_8_ = (double)local_168._8_8_ - local_e8[1] * dVar33;
        local_168._0_8_ = (double)local_168._0_8_ - local_e8[1] * dVar32;
        dVar44 = (double)local_158._8_8_ - local_e8[1] * dVar45;
        local_158._8_4_ = SUB84(dVar44,0);
        local_158._0_8_ = (double)local_158._0_8_ - local_e8[1] * dVar46;
        local_158._12_4_ = (int)((ulong)dVar44 >> 0x20);
      }
      if (dVar42 < ABS(local_a0)) {
        dVar44 = (double)auStack_98._8_8_ - local_a0 * dVar29;
        auStack_98._8_4_ = SUB84(dVar44,0);
        auStack_98._0_8_ = (double)auStack_98._0_8_ - local_a0 * dVar28;
        auStack_98._12_4_ = (int)((ulong)dVar44 >> 0x20);
        local_128._8_8_ = (double)local_128._8_8_ - local_a0 * dVar33;
        local_128._0_8_ = (double)local_128._0_8_ - local_a0 * dVar32;
        dVar44 = (double)local_118._8_8_ - local_a0 * dVar45;
        local_118._8_4_ = SUB84(dVar44,0);
        local_118._0_8_ = (double)local_118._0_8_ - local_a0 * dVar46;
        local_118._12_4_ = (int)((ulong)dVar44 >> 0x20);
      }
      auVar1 = local_118;
      auVar34 = local_128;
      if (dVar42 < ABS(local_80)) {
        dStack_78 = dStack_78 - local_80 * dVar28;
        dVar42 = local_70 - local_80 * dVar29;
        auVar8._8_4_ = SUB84(dVar42,0);
        auVar8._0_8_ = dStack_78;
        auVar8._12_4_ = (int)((ulong)dVar42 >> 0x20);
        local_70 = auVar8._8_8_;
        local_108._8_8_ = (double)local_108._8_8_ - local_80 * dVar33;
        local_108._0_8_ = (double)local_108._0_8_ - local_80 * dVar32;
        dVar42 = (double)local_f8._8_8_ - local_80 * dVar45;
        local_f8._8_4_ = SUB84(dVar42,0);
        local_f8._0_8_ = (double)local_f8._0_8_ - local_80 * dVar46;
        local_f8._12_4_ = (int)((ulong)dVar42 >> 0x20);
      }
      dVar44 = dStack_78;
      puVar21 = auStack_98;
      dVar42 = ABS((double)auStack_98._0_8_);
      uVar25 = 2;
      iVar15 = 2;
      for (uVar19 = 2; uVar19 != 4; uVar19 = uVar19 + 1) {
        for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
          dVar31 = ABS(*(double *)(puVar21 + lVar17 * 8));
          if (dVar42 < dVar31) {
            uVar25 = uVar19;
          }
          uVar25 = uVar25 & 0xffffffff;
          iVar24 = (int)lVar17 + 2;
          if (dVar31 <= dVar42) {
            iVar24 = iVar15;
            dVar31 = dVar42;
          }
          dVar42 = dVar31;
          iVar15 = iVar24;
        }
        puVar21 = puVar21 + 0x20;
      }
      dVar31 = local_68;
      if (dVar42 < local_68) {
        *pivot = dVar42;
        dVar31 = dVar42;
      }
      dVar10 = (double)auStack_98._0_8_;
      if ((int)uVar25 != 2) {
        uVar14 = auStack_98._8_8_;
        dStack_78 = (double)auStack_98._0_8_;
        auStack_98._8_8_ = local_70;
        local_70 = (double)uVar14;
        local_128 = local_108;
        local_108 = auVar34;
        local_118 = local_f8;
        local_f8 = auVar1;
        bVar26 = (bool)(bVar26 ^ 1);
        dVar10 = dVar44;
      }
      if (iVar15 == 2) {
        auVar30._8_8_ = dVar28;
        auVar30._0_8_ = dVar29;
        dVar28 = dVar10;
      }
      else {
        auVar9._8_4_ = SUB84(local_e8[2],0);
        auVar9._0_8_ = local_e8[3];
        auVar9._12_4_ = (int)((ulong)local_e8[2] >> 0x20);
        local_e8[2] = local_e8[3];
        local_e8[3] = auVar9._8_8_;
        dVar28 = (double)auStack_98._8_8_;
        auStack_98._8_8_ = dVar10;
        auVar35._8_4_ = SUB84(dStack_78,0);
        auVar35._0_8_ = local_70;
        auVar35._12_4_ = (int)((ulong)dStack_78 >> 0x20);
        dStack_78 = local_70;
        local_70 = auVar35._8_8_;
        bVar26 = (bool)(bVar26 ^ 1);
      }
      dVar29 = auVar30._0_8_;
      dVar44 = auVar30._8_8_;
      if (dVar42 <= 0.0) {
        iVar24 = 2;
      }
      else {
        dVar10 = (double)auStack_98._8_8_ / dVar28;
        auVar43._8_8_ = dVar28;
        auVar43._0_8_ = dVar28;
        local_128 = divpd(local_128,auVar43);
        local_118 = divpd(local_118,auVar43);
        dVar42 = dVar42 * 2.220446049250313e-16;
        dVar40 = local_128._0_8_;
        dVar41 = local_128._8_8_;
        dVar38 = local_118._0_8_;
        dVar39 = local_118._8_8_;
        if (dVar42 < ABS(local_e8[2])) {
          local_e8[3] = local_e8[3] - local_e8[2] * dVar10;
          local_168._8_8_ = (double)local_168._8_8_ - local_e8[2] * dVar41;
          local_168._0_8_ = (double)local_168._0_8_ - local_e8[2] * dVar40;
          local_158._8_8_ = (double)local_158._8_8_ - local_e8[2] * dVar39;
          local_158._0_8_ = (double)local_158._0_8_ - local_e8[2] * dVar38;
        }
        if (dVar42 < ABS(dVar44)) {
          dVar29 = dVar29 - dVar44 * dVar10;
          local_148._0_8_ = dVar32 - dVar44 * dVar40;
          local_148._8_8_ = dVar33 - dVar44 * dVar41;
          local_138._0_8_ = dVar46 - dVar44 * dVar38;
          local_138._8_8_ = dVar45 - dVar44 * dVar39;
        }
        dVar46 = local_70;
        if (dVar42 < ABS(dStack_78)) {
          local_108._8_8_ = (double)local_108._8_8_ - dStack_78 * dVar41;
          local_108._0_8_ = (double)local_108._0_8_ - dStack_78 * dVar40;
          local_f8._8_8_ = (double)local_f8._8_8_ - dStack_78 * dVar39;
          local_f8._0_8_ = (double)local_f8._0_8_ - dStack_78 * dVar38;
          dVar46 = local_70 - dStack_78 * dVar10;
        }
        dVar45 = ABS(dVar46);
        if (dVar45 < dVar31) {
          *pivot = dVar45;
        }
        if (dVar46 == 0.0) {
          iVar24 = 3;
        }
        else {
          auVar11._8_8_ = dVar46;
          auVar11._0_8_ = dVar46;
          local_108 = divpd(local_108,auVar11);
          auVar12._8_8_ = dVar46;
          auVar12._0_8_ = dVar46;
          local_f8 = divpd(local_f8,auVar12);
          dVar45 = dVar45 * 2.220446049250313e-16;
          dVar42 = local_108._0_8_;
          dVar44 = local_108._8_8_;
          dVar32 = local_f8._0_8_;
          dVar33 = local_f8._8_8_;
          if (dVar45 < ABS(local_e8[3])) {
            local_168._8_8_ = (double)local_168._8_8_ - local_e8[3] * dVar44;
            local_168._0_8_ = (double)local_168._0_8_ - local_e8[3] * dVar42;
            local_158._8_8_ = (double)local_158._8_8_ - local_e8[3] * dVar33;
            local_158._0_8_ = (double)local_158._0_8_ - local_e8[3] * dVar32;
          }
          if (dVar45 < ABS(dVar29)) {
            dVar31 = local_148._0_8_;
            local_148._8_8_ = local_148._8_8_ - dVar29 * dVar44;
            local_148._0_8_ = dVar31 - dVar29 * dVar42;
            dVar31 = local_138._0_8_;
            local_138._8_8_ = local_138._8_8_ - dVar29 * dVar33;
            local_138._0_8_ = dVar31 - dVar29 * dVar32;
          }
          if (dVar45 < ABS(dVar10)) {
            local_128._8_8_ = dVar41 - dVar44 * dVar10;
            local_128._0_8_ = dVar40 - dVar42 * dVar10;
            local_118._8_8_ = dVar39 - dVar10 * dVar33;
            local_118._0_8_ = dVar38 - dVar10 * dVar32;
          }
          dVar46 = ((local_48 / local_c0) / dVar28) / dVar46;
          if (bVar26) {
            dVar46 = -dVar46;
          }
          *determinant = dVar46;
          iVar24 = 4;
        }
      }
      auVar1 = local_118;
      auVar34 = local_128;
      if (iVar15 != 2) {
        local_128 = local_108;
        local_108 = auVar34;
        local_118 = local_f8;
        local_f8 = auVar1;
      }
    }
    if (j1 != 1) {
      SwapRow((double (*) [4])local_168,1,j1);
    }
  }
  if (iVar22 != 0) {
    SwapRow((double (*) [4])local_168,0,iVar22);
  }
  pdVar16 = (double *)local_168;
  for (lVar17 = 0x10; lVar17 != 0; lVar17 = lVar17 + -1) {
    (*dst)[0] = *pdVar16;
    pdVar16 = pdVar16 + (ulong)bVar27 * -2 + 1;
    dst = (double (*) [4])((long)dst + ((ulong)bVar27 * -2 + 1) * 8);
  }
  return iVar24;
}

Assistant:

static int Inv( const double* src, double dst[4][4], double* determinant, double* pivot )
{
  // returns rank (0, 1, 2, 3, or 4), inverse, and smallest pivot

	double M[4][4], I[4][4], x, c, d;
	int i, j, ix, jx;
  int col[4] = {0,1,2,3};
  int swapcount = 0;
  int rank = 0;

  *pivot = 0.0;
  *determinant = 0.0;

  memset( I, 0, sizeof(I) );
  I[0][0] = I[1][1] = I[2][2] = I[3][3] = 1.0;

  memcpy( M, src, sizeof(M) );

  // some loops unrolled for speed

  ix = jx = 0;
	x = fabs(M[0][0]);
  for ( i = 0; i < 4; i++ ) for ( j = 0; j < 4; j++ ) {
    if ( fabs(M[i][j]) > x ) {
      ix = i;
      jx = j;
      x = fabs(M[i][j]);
    }
  }
  *pivot = x;
  if ( ix != 0 ) {
    SwapRow( M, 0, ix );
    SwapRow( I, 0, ix );
    swapcount++;
  }
  if ( jx != 0 ) {
    SwapCol( M, 0, jx );
    col[0] = jx;
    swapcount++;
  }

  if ( x > 0.0 ) {
    rank++;

    // 17 August 2011 Dale Lear
    //   The result is slightly more accurate when using division
    //   instead of multiplying by the inverse of M[0][0]. If there
    //   is any speed penalty at this point in history, the accuracy
    //   is more important than the additional clocks.
    //c = d = 1.0/M[0][0];
    //M[0][1] *= c; M[0][2] *= c; M[0][3] *= c;
    //ScaleRow( I, c, 0 );
    c = M[0][0];
    M[0][1] /= c; M[0][2] /= c; M[0][3] /= c;
    I[0][0] /= c; I[0][1] /= c; I[0][2] /= c; I[0][3] /= c;
    d = 1.0/c;

    x *=  ON_EPSILON;

	  if (fabs(M[1][0]) > x) {
		  c = -M[1][0];
      M[1][1] += c*M[0][1]; M[1][2] += c*M[0][2]; M[1][3] += c*M[0][3];
      AddCxRow( I, c, 0, 1 );
	  }
	  if (fabs(M[2][0]) >  x) {
		  c = -M[2][0];
      M[2][1] += c*M[0][1]; M[2][2] += c*M[0][2]; M[2][3] += c*M[0][3];
      AddCxRow( I, c, 0, 2 );
	  }
	  if (fabs(M[3][0]) >  x) {
		  c = -M[3][0];
      M[3][1] += c*M[0][1]; M[3][2] += c*M[0][2]; M[3][3] += c*M[0][3];
      AddCxRow( I, c, 0, 3 );
	  }

    ix = jx = 1;
	  x = fabs(M[1][1]);
    for ( i = 1; i < 4; i++ ) for ( j = 1; j < 4; j++ ) {
      if ( fabs(M[i][j]) > x ) {
        ix = i;
        jx = j;
        x = fabs(M[i][j]);
      }
    }
    if ( x < *pivot )
      *pivot = x;
    if ( ix != 1 ) {
      SwapRow( M, 1, ix );
      SwapRow( I, 1, ix );
      swapcount++;
    }
    if ( jx != 1 ) {
      SwapCol( M, 1, jx );
      col[1] = jx;
      swapcount++;
    }
    if ( x > 0.0 ) {
      rank++;

      // 17 August 2011 Dale Lear
      //   The result is slightly more accurate when using division
      //   instead of multiplying by the inverse of M[1][1]. If there
      //   is any speed penalty at this point in history, the accuracy
      //   is more important than the additional clocks.
      //c = 1.0/M[1][1];
      //d *= c;
      //M[1][2] *= c; M[1][3] *= c;
      //ScaleRow( I, c, 1 );
      c = M[1][1];
      M[1][2] /= c; M[1][3] /= c;
      I[1][0] /= c; I[1][1] /= c; I[1][2] /= c; I[1][3] /= c;
      d /= c;

      x *= ON_EPSILON;
      if (fabs(M[0][1]) >  x) {
        c = -M[0][1];
        M[0][2] += c*M[1][2]; M[0][3] += c*M[1][3];
        AddCxRow( I, c, 1, 0 );
      }
      if (fabs(M[2][1]) >  x) {
        c = -M[2][1];
        M[2][2] += c*M[1][2]; M[2][3] += c*M[1][3];
        AddCxRow( I, c, 1, 2 );
      }
      if (fabs(M[3][1]) >  x) {
        c = -M[3][1];
        M[3][2] += c*M[1][2]; M[3][3] += c*M[1][3];
        AddCxRow( I, c, 1, 3 );
      }

      ix = jx = 2;
	    x = fabs(M[2][2]);
      for ( i = 2; i < 4; i++ ) for ( j = 2; j < 4; j++ ) {
        if ( fabs(M[i][j]) > x ) {
          ix = i;
          jx = j;
          x = fabs(M[i][j]);
        }
      }
      if ( x < *pivot )
        *pivot = x;
      if ( ix != 2 ) {
        SwapRow( M, 2, ix );
        SwapRow( I, 2, ix );
        swapcount++;
      }
      if ( jx != 2 ) {
        SwapCol( M, 2, jx );
        col[2] = jx;
        swapcount++;
      }
      if ( x > 0.0 ) {
        rank++;

        // 17 August 2011 Dale Lear
        //   The result is slightly more accurate when using division
        //   instead of multiplying by the inverse of M[2][2]. If there
        //   is any speed penalty at this point in history, the accuracy
        //   is more important than the additional clocks.
        //c = 1.0/M[2][2];
        //d *= c;
        //M[2][3] *= c;
        //ScaleRow( I, c, 2 );
        c = M[2][2];
        M[2][3] /= c;
        I[2][0] /= c; I[2][1] /= c; I[2][2] /= c; I[2][3] /= c;
        d /= c;

        x *= ON_EPSILON;
        if (fabs(M[0][2]) >  x) {
          c = -M[0][2];
          M[0][3] += c*M[2][3];
          AddCxRow( I, c, 2, 0 );
        }
        if (fabs(M[1][2]) >  x) {
          c = -M[1][2];
          M[1][3] += c*M[2][3];
          AddCxRow( I, c, 2, 1 );
        }
        if (fabs(M[3][2]) >  x) {
          c = -M[3][2];
          M[3][3] += c*M[2][3];
          AddCxRow( I, c, 2, 3 );
        }

        x = fabs(M[3][3]);
        if ( x < *pivot )
          *pivot = x;

        if ( x > 0.0 ) {
          rank++;

          // 17 August 2011 Dale Lear
          //   The result is slightly more accurate when using division
          //   instead of multiplying by the inverse of M[3][3]. If there
          //   is any speed penalty at this point in history, the accuracy
          //   is more important than the additional clocks.
          //c = 1.0/M[3][3];
          //d *= c;
          //ScaleRow( I, c, 3 );
          c = M[3][3];
          I[3][0] /= c; I[3][1] /= c; I[3][2] /= c; I[3][3] /= c;
          d /= c;

          x *= ON_EPSILON;
          if (fabs(M[0][3]) >  x) {
            AddCxRow( I, -M[0][3], 3, 0 );
          }
          if (fabs(M[1][3]) >  x) {
            AddCxRow( I, -M[1][3], 3, 1 );
          }
          if (fabs(M[2][3]) >  x) {
            AddCxRow( I, -M[2][3], 3, 2 );
          }

          *determinant = (swapcount%2) ? -d : d;
        }
      }
    }
  }

  if ( col[3] != 3 )
    SwapRow( I, 3, col[3] );
  if ( col[2] != 2 )
    SwapRow( I, 2, col[2] );
  if ( col[1] != 1 )
    SwapRow( I, 1, col[1] );
  if ( col[0] != 0 )
    SwapRow( I, 0, col[0] );

  memcpy( dst, I, sizeof(I) );
	return rank;
}